

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshFileLoader.cpp
# Opt level: O2

void chrono::fea::ChMeshFileLoader::FromAbaqusFile
               (shared_ptr<chrono::fea::ChMesh> *mesh,char *filename,
               shared_ptr<chrono::fea::ChContinuumMaterial> *my_material,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>_>_>
               *node_sets,ChVector<double> *pos_transform,ChMatrix33<double> *rot_transform,
               bool discard_unused_nodes)

{
  _Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
  *p_Var1;
  undefined1 auVar2 [16];
  ChMesh *pCVar3;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  *pvVar4;
  element_type *peVar5;
  _Alloc_hider _Var6;
  double dVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  int iVar11;
  ChLog *pCVar12;
  ChStreamOutAscii *pCVar13;
  istream *piVar14;
  mapped_type *pmVar15;
  _Base_ptr p_Var16;
  ChException *pCVar17;
  uint uVar18;
  size_type sVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  _Alloc_hider this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
  *p_Var23;
  size_type sVar24;
  string *this_01;
  shared_ptr<chrono::fea::ChContinuumElastic> *this_02;
  long lVar25;
  shared_ptr<chrono::fea::ChNodeFEAxyz> sVar26;
  shared_ptr<chrono::fea::ChNodeFEAxyzP> sVar27;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>_>,_bool>
  pVar28;
  shared_ptr<chrono::fea::ChElementTetraCorot_4> mel;
  double local_908;
  uint local_8f4;
  string token;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode;
  string line;
  _Base_ptr local_888;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_838;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_828;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_818;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_808;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_7f8;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_7e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7e0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_7d8;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_7c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_7b8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_7a8;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_798 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_790;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_788 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_780;
  map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
  parsed_nodes;
  __shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2> local_748;
  __shared_ptr<chrono::fea::ChContinuumPoisson3D,_(__gnu_cxx::_Lock_policy)2> local_738;
  __shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> local_728;
  double tokenvals [20];
  istringstream stoken;
  undefined4 uStack_674;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_668;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  istringstream ss;
  ifstream fin;
  int aiStack_218 [122];
  
  parsed_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parsed_nodes._M_t._M_impl.super__Rb_tree_header._M_header;
  parsed_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parsed_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parsed_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parsed_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parsed_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::ifstream::ifstream(&fin,filename,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(_fin + -0x18)) != 0) {
    pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&stoken,filename,(allocator *)tokenvals);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   "ERROR opening Abaqus .inp file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stoken);
    std::operator+(&local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,"\n");
    ChException::ChException(pCVar17,&local_3d8);
    __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
  }
  pCVar12 = GetLog();
  pCVar13 = ChStreamOutAscii::operator<<
                      (&pCVar12->super_ChStreamOutAscii,"Parsing Abaqus INP file: ");
  pCVar13 = ChStreamOutAscii::operator<<(pCVar13,filename);
  ChStreamOutAscii::operator<<(pCVar13,"\n");
  line._M_dataplus._M_p = (pointer)&line.field_2;
  uVar18 = 0;
  local_888 = (_Base_ptr)0x0;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
LAB_00b3fa98:
    do {
      __it._M_current = (char *)&line;
      piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&fin,(string *)__it._M_current);
      _Var6 = line._M_dataplus;
      if (((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) != 0) {
        if (discard_unused_nodes) {
          for (p_Var16 = parsed_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var16 != &parsed_nodes._M_t._M_impl.super__Rb_tree_header;
              p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
            if (*(char *)&p_Var16[1]._M_right == '\x01') {
              pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              std::__shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr(&local_748,
                           (__shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2> *)
                           &p_Var16[1]._M_parent);
              ChMesh::AddNode(pCVar3,(shared_ptr<chrono::fea::ChNodeFEAbase> *)&local_748);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_748._M_refcount);
            }
          }
        }
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream(&fin);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
        ::~_Rb_tree(&parsed_nodes._M_t);
        return;
      }
      p_Var1 = (_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                *)(line._M_dataplus._M_p + line._M_string_length);
      sVar19 = line._M_string_length;
      this = line._M_dataplus;
      for (lVar25 = (long)line._M_string_length >> 2; 0 < lVar25; lVar25 = lVar25 + -1) {
        bVar10 = __gnu_cxx::__ops::
                 _Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::$_0>
                 ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                               *)this._M_p,__it);
        p_Var23 = (_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                   *)this._M_p;
        if (bVar10) goto LAB_00b3fb82;
        bVar10 = __gnu_cxx::__ops::
                 _Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::$_0>
                 ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                               *)this._M_p + 1,__it);
        p_Var23 = (_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                   *)this._M_p + 1;
        if (bVar10) goto LAB_00b3fb82;
        bVar10 = __gnu_cxx::__ops::
                 _Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::$_0>
                 ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                               *)this._M_p + 2,__it);
        p_Var23 = (_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                   *)this._M_p + 2;
        if (bVar10) goto LAB_00b3fb82;
        bVar10 = __gnu_cxx::__ops::
                 _Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::$_0>
                 ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                               *)this._M_p + 3,__it);
        p_Var23 = (_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                   *)this._M_p + 3;
        if (bVar10) goto LAB_00b3fb82;
        this._M_p = this._M_p + 4;
        sVar19 = sVar19 - 4;
      }
      if (sVar19 == 1) {
LAB_00b3fb6c:
        bVar10 = __gnu_cxx::__ops::
                 _Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::$_0>
                 ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                               *)this._M_p,__it);
        p_Var23 = p_Var1;
        if (bVar10) {
          p_Var23 = (_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                     *)this._M_p;
        }
      }
      else if (sVar19 == 2) {
LAB_00b3fb4e:
        bVar10 = __gnu_cxx::__ops::
                 _Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::$_0>
                 ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                               *)this._M_p,__it);
        p_Var23 = (_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                   *)this._M_p;
        if (!bVar10) {
          this._M_p = this._M_p + 1;
          goto LAB_00b3fb6c;
        }
      }
      else {
        p_Var23 = p_Var1;
        if ((sVar19 == 3) &&
           (bVar10 = __gnu_cxx::__ops::
                     _Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::$_0>
                     ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                                   *)this._M_p,__it),
           p_Var23 = (_Iter_pred<chrono::fea::ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChContinuumMaterial>,std::map<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,bool)::__0>
                      *)this._M_p, !bVar10)) {
          this._M_p = this._M_p + 1;
          goto LAB_00b3fb4e;
        }
      }
LAB_00b3fb82:
      std::__cxx11::string::erase(&line,_Var6._M_p,p_Var23);
      sVar19 = line._M_string_length;
      _Var6 = line._M_dataplus;
      for (sVar24 = 0; sVar19 != sVar24; sVar24 = sVar24 + 1) {
        iVar11 = toupper((uint)(byte)_Var6._M_p[sVar24]);
        _Var6._M_p[sVar24] = (char)iVar11;
      }
    } while (*line._M_dataplus._M_p == '\0');
    if (*line._M_dataplus._M_p != '*') {
      if (uVar18 == 1) {
        token._M_dataplus._M_p = (pointer)&token.field_2;
        token._M_string_length = 0;
        token.field_2._M_local_buf[0] = '\0';
        std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&line,_S_in);
        for (uVar20 = 0;
            (piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)&ss,(string *)&token,','), dVar9 = tokenvals[3],
            dVar8 = tokenvals[2], dVar7 = tokenvals[1],
            ((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) == 0 && (uVar20 < 0x14))
            ; uVar20 = uVar20 + 1) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&stoken,(string *)&token,_S_in);
          std::istream::_M_extract<double>((double *)&stoken);
          std::__cxx11::istringstream::~istringstream((istringstream *)&stoken);
        }
        if (uVar20 != 4) {
          pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stoken,
                         "ERROR in .inp file, nodes require ID and three x y z coords, see line:\n",
                         &line);
          std::operator+(&local_438,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stoken,"\n");
          ChException::ChException(pCVar17,&local_438);
          __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
        }
        if ((((tokenvals[1] == -1e+31) && (!NAN(tokenvals[1]))) ||
            ((tokenvals[2] == -1e+31 && (!NAN(tokenvals[2]))))) ||
           ((tokenvals[3] == -1e+31 && (!NAN(tokenvals[3]))))) {
          pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stoken,"ERROR in .inp file, in parsing x,y,z coordinates of node: \n",
                         &line);
          std::operator+(&local_458,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stoken,"\n");
          ChException::ChException(pCVar17,&local_458);
          __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
        }
        _stoken = (pointer)tokenvals[1];
        _Stack_670._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tokenvals[2];
        aStack_668._M_allocated_capacity = (size_type)tokenvals[3];
        ChMatrix33<double>::operator*(rot_transform,(ChVector<double> *)&stoken);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = tokenvals[0];
        uVar22 = vcvttsd2usi_avx512f(auVar2);
        _stoken = (pointer)((double)mel.
                                    super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + pos_transform->m_data[0]);
        _Stack_670._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (mel.super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi + pos_transform->m_data[1]);
        aStack_668._M_allocated_capacity = (size_type)(local_908 + pos_transform->m_data[2]);
        std::dynamic_pointer_cast<chrono::fea::ChContinuumElastic,chrono::fea::ChContinuumMaterial>
                  ((shared_ptr<chrono::fea::ChContinuumMaterial> *)&mel);
        peVar5 = mel.
                 super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mel.
                    super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        if (peVar5 == (element_type *)0x0) {
          std::
          dynamic_pointer_cast<chrono::fea::ChContinuumPoisson3D,chrono::fea::ChContinuumMaterial>
                    ((shared_ptr<chrono::fea::ChContinuumMaterial> *)&mel);
          peVar5 = mel.
                   super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mel.
                      super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (peVar5 == (element_type *)0x0) {
            pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&local_478,
                       "ERROR in .inp generation. Material type not supported. \n",(allocator *)&mel
                      );
            ChException::ChException(pCVar17,&local_478);
            __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
          }
          mel.super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)dVar7;
          mel.super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar8;
          sVar27 = std::make_shared<chrono::fea::ChNodeFEAxyzP,chrono::ChVector<double>>
                             ((ChVector<double> *)&mnode);
          (*((mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[4])
                    (mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(ulong)uVar22,
                     sVar27.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
          std::__shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2> *)&mel,
                     (__shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2> *)&mnode)
          ;
          local_908 = (double)((ulong)dVar9 & 0xffffffffffffff00);
          local_8f4 = uVar22;
          pmVar15 = std::
                    map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                    ::operator[](&parsed_nodes,&local_8f4);
          std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,bool>::operator=
                    ((pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,bool> *)pmVar15,
                     (pair<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>,_bool> *)&mel);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mel.
                      super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (!discard_unused_nodes) {
            pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<chrono::fea::ChNodeFEAxyzP,void>
                      (local_798,
                       (__shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2> *)
                       &mnode);
            ChMesh::AddNode(pCVar3,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_798);
            this_00 = &local_790;
            goto LAB_00b3fed5;
          }
        }
        else {
          sVar26 = std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>&>
                             ((ChVector<double> *)&mnode);
          (*((mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[4])
                    (mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(ulong)uVar22,
                     sVar26.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
          std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)&mel,
                     &mnode.
                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
          local_908 = (double)((ulong)local_908 & 0xffffffffffffff00);
          local_8f4 = uVar22;
          pmVar15 = std::
                    map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                    ::operator[](&parsed_nodes,&local_8f4);
          std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,bool>::operator=
                    ((pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,bool> *)pmVar15,
                     (pair<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_bool> *)&mel);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mel.
                      super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (!discard_unused_nodes) {
            pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
                      (local_788,
                       &mnode.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
            ChMesh::AddNode(pCVar3,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_788);
            this_00 = &local_780;
LAB_00b3fed5:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mnode.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
        std::__cxx11::string::~string((string *)&token);
      }
      if ((uVar18 & 0xfffffffe) == 2) {
        token._M_dataplus._M_p = (pointer)&token.field_2;
        token._M_string_length = 0;
        token.field_2._M_local_buf[0] = '\0';
        std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&line,_S_in);
        for (uVar20 = 0;
            (piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)&ss,(string *)&token,','),
            ((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) == 0 && (uVar20 < 0x14))
            ; uVar20 = uVar20 + 1) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&stoken,(string *)&token,_S_in);
          std::istream::_M_extract<unsigned_int>((uint *)&stoken);
          std::__cxx11::istringstream::~istringstream((istringstream *)&stoken);
        }
        if (uVar18 == 2) {
          if (uVar20 != 5) {
            pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stoken,
                           "ERROR in .inp file, tetrahedrons require ID and 4 node IDs, see line:\n"
                           ,&line);
            std::operator+(&local_4b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stoken,"\n");
            ChException::ChException(pCVar17,&local_4b8);
            __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
          }
        }
        else if ((uVar18 == 3) && (uVar20 != 0xb)) {
          pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stoken,
                         "ERROR in .inp file, tetrahedrons require ID and 10 node IDs, see line:\n",
                         &line);
          std::operator+(&local_498,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stoken,"\n");
          ChException::ChException(pCVar17,&local_498);
          __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
        }
        std::dynamic_pointer_cast<chrono::fea::ChContinuumElastic,chrono::fea::ChContinuumMaterial>
                  ((shared_ptr<chrono::fea::ChContinuumMaterial> *)&stoken);
        if (_stoken == (pointer)0x0) {
          std::
          dynamic_pointer_cast<chrono::fea::ChContinuumPoisson3D,chrono::fea::ChContinuumMaterial>
                    ((shared_ptr<chrono::fea::ChContinuumMaterial> *)&mel);
          peVar5 = mel.
                   super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mel.
                      super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_670);
          if (peVar5 == (element_type *)0x0) {
            pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&local_4d8,
                       "ERROR in .inp generation. Material type not supported.\n",
                       (allocator *)&stoken);
            ChException::ChException(pCVar17,&local_4d8);
            __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
          }
        }
        else {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_670);
        }
        _stoken = (pointer)0x0;
        _Stack_670._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        aStack_668._M_allocated_capacity = 0;
        aStack_668._8_8_ = 0;
        uStack_658 = 0;
        uStack_650 = 0;
        uStack_648 = 0;
        uStack_640 = 0;
        this_01 = (string *)&stoken;
        for (lVar25 = 1; lVar25 != 5; lVar25 = lVar25 + 1) {
          mel.super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)
                   CONCAT44(mel.
                            super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr._4_4_,*(undefined4 *)((long)tokenvals + lVar25 * 4));
          pmVar15 = std::
                    map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                    ::at(&parsed_nodes,(key_type *)&mel);
          std::__shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2> *)this_01
                     ,(__shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2> *)
                      pmVar15);
          pmVar15->second = true;
          this_01 = (string *)&this_01->field_2;
        }
        std::dynamic_pointer_cast<chrono::fea::ChContinuumElastic,chrono::fea::ChContinuumMaterial>
                  ((shared_ptr<chrono::fea::ChContinuumMaterial> *)&mel);
        peVar5 = mel.
                 super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mel.
                    super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        if (peVar5 == (element_type *)0x0) {
          std::
          dynamic_pointer_cast<chrono::fea::ChContinuumPoisson3D,chrono::fea::ChContinuumMaterial>
                    ((shared_ptr<chrono::fea::ChContinuumMaterial> *)&mel);
          peVar5 = mel.
                   super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mel.
                      super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (peVar5 != (element_type *)0x0) {
            chrono_types::make_shared<chrono::fea::ChElementTetraCorot_4_P,_0>();
            peVar5 = mel.
                     super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            std::static_pointer_cast<chrono::fea::ChNodeFEAxyzP,chrono::fea::ChNodeFEAbase>
                      (&local_818);
            std::static_pointer_cast<chrono::fea::ChNodeFEAxyzP,chrono::fea::ChNodeFEAbase>
                      (&local_828);
            std::static_pointer_cast<chrono::fea::ChNodeFEAxyzP,chrono::fea::ChNodeFEAbase>
                      (&local_838);
            std::static_pointer_cast<chrono::fea::ChNodeFEAxyzP,chrono::fea::ChNodeFEAbase>
                      (&local_7d8);
            (*(peVar5->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0x16])
                      (peVar5,&local_818,&local_828,&local_838,&local_7d8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_7d8.
                        super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_838.
                        super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_828.
                        super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_818.
                        super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            pvVar4 = &(mel.
                       super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->nodes;
            std::
            static_pointer_cast<chrono::fea::ChContinuumPoisson3D,chrono::fea::ChContinuumMaterial>
                      ((shared_ptr<chrono::fea::ChContinuumMaterial> *)&local_738);
            std::__shared_ptr<chrono::fea::ChContinuumPoisson3D,_(__gnu_cxx::_Lock_policy)2>::
            operator=((__shared_ptr<chrono::fea::ChContinuumPoisson3D,_(__gnu_cxx::_Lock_policy)2> *
                      )&(pvVar4->
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage,&local_738);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_738._M_refcount)
            ;
            pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<chrono::fea::ChElementTetraCorot_4_P,void>
                      (local_7e8,
                       (__shared_ptr<chrono::fea::ChElementTetraCorot_4_P,_(__gnu_cxx::_Lock_policy)2>
                        *)&mel);
            ChMesh::AddElement(pCVar3,(shared_ptr<chrono::fea::ChElementBase> *)local_7e8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7e0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&mel.
                        super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
        }
        else {
          chrono_types::make_shared<chrono::fea::ChElementTetraCorot_4,_0>();
          peVar5 = mel.
                   super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          std::static_pointer_cast<chrono::fea::ChNodeFEAxyz,chrono::fea::ChNodeFEAbase>(&local_7f8)
          ;
          std::static_pointer_cast<chrono::fea::ChNodeFEAxyz,chrono::fea::ChNodeFEAbase>(&local_808)
          ;
          std::static_pointer_cast<chrono::fea::ChNodeFEAxyz,chrono::fea::ChNodeFEAbase>(&local_7a8)
          ;
          std::static_pointer_cast<chrono::fea::ChNodeFEAxyz,chrono::fea::ChNodeFEAbase>(&local_7b8)
          ;
          (*(peVar5->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[7])
                    (peVar5,&local_7f8,&local_808,&local_7a8,&local_7b8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_7b8.
                      super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_7a8.
                      super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_808.
                      super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_7f8.
                      super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this_02 = &(mel.
                      super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->Material;
          std::static_pointer_cast<chrono::fea::ChContinuumElastic,chrono::fea::ChContinuumMaterial>
                    ((shared_ptr<chrono::fea::ChContinuumMaterial> *)&local_728);
          std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&this_02->
                      super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                     ,&local_728);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_728._M_refcount);
          pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::fea::ChElementTetraCorot_4,void>
                    (local_7c8,
                     &mel.
                      super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                    );
          ChMesh::AddElement(pCVar3,(shared_ptr<chrono::fea::ChElementBase> *)local_7c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7c0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mel.
                      super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        std::array<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_4UL>::~array
                  ((array<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_4UL> *)&stoken);
        std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
        std::__cxx11::string::~string((string *)&token);
      }
      if (uVar18 == 4) {
        token._M_dataplus._M_p = (pointer)&token.field_2;
        token._M_string_length = 0;
        token.field_2._M_local_buf[0] = '\0';
        std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&line,_S_in);
        uVar20 = 0;
        while (((piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)&ss,(string *)&token,','),
                ((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) == 0 &&
                (uVar20 < 0x14)) &&
               ((token._M_string_length == 0 ||
                (token._M_dataplus._M_p[token._M_string_length - 1] != '\r'))))) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&stoken,(string *)&token,_S_in);
          std::istream::_M_extract<unsigned_int>((uint *)&stoken);
          uVar20 = uVar20 + 1;
          std::__cxx11::istringstream::~istringstream((istringstream *)&stoken);
        }
        for (uVar21 = 0; uVar20 != uVar21; uVar21 = uVar21 + 1) {
          iVar11 = *(int *)((long)tokenvals + uVar21 * 4);
          if (iVar11 < 1) {
            pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
            std::__cxx11::to_string((string *)&stoken,*(uint *)((long)tokenvals + uVar21 * 4));
            std::operator+(&local_4f8,"ERROR in .inp file, negative node ID: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stoken);
            ChException::ChException(pCVar17,&local_4f8);
            __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
          }
          _stoken = iVar11;
          pmVar15 = std::
                    map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                    ::at(&parsed_nodes,(key_type *)&stoken);
          std::
          vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
          ::push_back((vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                       *)local_888,&pmVar15->first);
          pmVar15->second = true;
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
        std::__cxx11::string::~string((string *)&token);
      }
      goto LAB_00b3fa98;
    }
    uVar18 = 0;
    lVar25 = std::__cxx11::string::find((char *)&line,0xe8d50e);
    if (lVar25 == 0) {
      lVar25 = std::__cxx11::string::find((char *)&line,0xe8d514);
      uVar18 = 1;
      if (lVar25 != 0) {
        std::__cxx11::string::find((char *)&line,0xf62c17);
        std::__cxx11::string::substr((ulong)&ss,(ulong)&line);
        pCVar12 = GetLog();
        pCVar13 = ChStreamOutAscii::operator<<(&pCVar12->super_ChStreamOutAscii,"| parsing nodes ");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,(string *)&ss);
        ChStreamOutAscii::operator<<(pCVar13,"\n");
        std::__cxx11::string::~string((string *)&ss);
        uVar18 = 1;
      }
    }
    lVar25 = std::__cxx11::string::find((char *)&line,0xe8d52b);
    if (lVar25 == 0) {
      lVar25 = std::__cxx11::string::find((char *)&line,0xe8d554);
      if (lVar25 != 0) {
        std::__cxx11::string::find((char *)&line,0xf62c17);
        std::__cxx11::string::substr((ulong)&ss,(ulong)&line);
        bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ss,"C3D10");
        uVar18 = 3;
        if (!bVar10) {
          bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ss,"DC3D10");
          uVar18 = 3;
          if (!bVar10) {
            bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ss,"C3D4");
            uVar18 = 2;
            if (!bVar10) {
              pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
              std::operator+(&token,"ERROR in .inp file, TYPE=",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ss);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             tokenvals,&token,
                             " (only C3D10 or DC3D10 or C3D4 tetrahedrons supported) see: \n");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stoken,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)tokenvals,&line);
              std::operator+(&local_3f8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stoken,"\n");
              ChException::ChException(pCVar17,&local_3f8);
              __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
            }
          }
        }
        std::__cxx11::string::~string((string *)&ss);
      }
      lVar25 = std::__cxx11::string::find((char *)&line,0xe8d598);
      if (lVar25 != 0) {
        std::__cxx11::string::find((char *)&line,0xf62c17);
        std::__cxx11::string::substr((ulong)&ss,(ulong)&line);
        pCVar12 = GetLog();
        pCVar13 = ChStreamOutAscii::operator<<
                            (&pCVar12->super_ChStreamOutAscii,"| parsing element set: ");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,(string *)&ss);
        ChStreamOutAscii::operator<<(pCVar13,"\n");
        std::__cxx11::string::~string((string *)&ss);
      }
    }
    lVar25 = std::__cxx11::string::find((char *)&line,0xe8d5b7);
    if (lVar25 == 0) {
      lVar25 = std::__cxx11::string::find((char *)&line,0xe8d514);
      uVar18 = 4;
      if (lVar25 != 0) {
        std::__cxx11::string::find((char *)&line,0xf62c17);
        std::__cxx11::string::substr((ulong)&stoken,(ulong)&line);
        pCVar12 = GetLog();
        pCVar13 = ChStreamOutAscii::operator<<
                            (&pCVar12->super_ChStreamOutAscii,"| parsing nodeset: ");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,(string *)&stoken);
        ChStreamOutAscii::operator<<(pCVar13,"\n");
        tokenvals[2] = 0.0;
        tokenvals[0] = 0.0;
        tokenvals[1] = 0.0;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>
                    *)&ss,(string *)&stoken,
                   (vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                    *)tokenvals);
        pVar28 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>
                 ::
                 _M_emplace_unique<std::pair<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>
                             *)node_sets,
                            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>
                             *)&ss);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>
                 *)&ss);
        std::
        vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ::~vector((vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                   *)tokenvals);
        if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&local_418,
                     "ERROR in .inp file, multiple NSET with same name has been specified\n",
                     (allocator *)&ss);
          ChException::ChException(pCVar17,&local_418);
          __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
        }
        local_888 = pVar28.first._M_node._M_node + 2;
        std::__cxx11::string::~string((string *)&stoken);
        uVar18 = 4;
      }
    }
  } while( true );
}

Assistant:

void ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<ChMesh> mesh,
                                      const char* filename,
                                      std::shared_ptr<ChContinuumMaterial> my_material,
                                      std::map<std::string, std::vector<std::shared_ptr<ChNodeFEAbase>>>& node_sets,
                                      ChVector<> pos_transform,
                                      ChMatrix33<> rot_transform,
                                      bool discard_unused_nodes) {
    std::map<unsigned int, std::pair<std::shared_ptr<ChNodeFEAbase>, bool>> parsed_nodes;
    std::vector<std::shared_ptr<ChNodeFEAbase>>* current_nodeset_vector = nullptr;

    enum eChAbaqusParserSection {
        E_PARSE_UNKNOWN = 0,
        E_PARSE_NODES_XYZ,
        E_PARSE_TETS_4,
        E_PARSE_TETS_10,
        E_PARSE_NODESET
    } e_parse_section = E_PARSE_UNKNOWN;

    std::ifstream fin(filename);
    if (fin.good())
        GetLog() << "Parsing Abaqus INP file: " << filename << "\n";
    else
        throw ChException("ERROR opening Abaqus .inp file: " + std::string(filename) + "\n");

    std::string line;
    while (std::getline(fin, line)) {
        // trims white space from the beginning of the string
        line.erase(line.begin(),
                   std::find_if(line.begin(), line.end(), [](unsigned char c) { return !std::isspace(c); }));

        // convert parsed line to uppercase (since string::find is case sensitive and Abaqus INP is not)
        std::for_each(line.begin(), line.end(), [](char& c) { c = toupper(static_cast<unsigned char>(c)); });

        // skip empty lines
        if (line[0] == 0)
            continue;

        // check if the current line opens a new section
        if (line[0] == '*') {
            e_parse_section = E_PARSE_UNKNOWN;

            if (line.find("*NODE") == 0) {
                std::string::size_type nse = line.find("NSET=");
                if (nse > 0) {
                    std::string::size_type ncom = line.find(",", nse);
                    std::string s_node_set = line.substr(nse + 5, ncom - (nse + 5));
                    GetLog() << "| parsing nodes " << s_node_set << "\n";
                }
                e_parse_section = E_PARSE_NODES_XYZ;
            }

            if (line.find("*ELEMENT") == 0) {
                std::string::size_type nty = line.find("TYPE=");
                if (nty > 0) {
                    std::string::size_type ncom = line.find(",", nty);
                    std::string s_ele_type = line.substr(nty + 5, ncom - (nty + 5));
                    e_parse_section = E_PARSE_UNKNOWN;
                    if (s_ele_type == "C3D10") {
                        e_parse_section = E_PARSE_TETS_10;
                    } else if (s_ele_type == "DC3D10") {
                        e_parse_section = E_PARSE_TETS_10;
                    } else if (s_ele_type == "C3D4") {
                        e_parse_section = E_PARSE_TETS_4;
                    }
                    if (e_parse_section == E_PARSE_UNKNOWN) {
                        throw ChException("ERROR in .inp file, TYPE=" + s_ele_type +
                                          " (only C3D10 or DC3D10 or C3D4 tetrahedrons supported) see: \n" + line +
                                          "\n");
                    }
                }
                std::string::size_type nse = line.find("ELSET=");
                if (nse > 0) {
                    std::string::size_type ncom = line.find(",", nse);
                    std::string s_ele_set = line.substr(nse + 6, ncom - (nse + 6));
                    GetLog() << "| parsing element set: " << s_ele_set << "\n";
                }
            }

            if (line.find("*NSET") == 0) {
                std::string::size_type nse = line.find("NSET=", 5);
                if (nse > 0) {
                    std::string::size_type ncom = line.find(",", nse);
                    std::string s_node_set = line.substr(nse + 5, ncom - (nse + 5));
                    GetLog() << "| parsing nodeset: " << s_node_set << "\n";
                    auto new_node =
                        node_sets.insert(std::pair<std::string, std::vector<std::shared_ptr<ChNodeFEAbase>>>(
                            s_node_set, std::vector<std::shared_ptr<ChNodeFEAbase>>()));
                    if (new_node.second) {
                        current_nodeset_vector = &new_node.first->second;
                    } else
                        throw ChException("ERROR in .inp file, multiple NSET with same name has been specified\n");
                }
                e_parse_section = E_PARSE_NODESET;
            }

            continue;
        }

        // node parsing
        if (e_parse_section == E_PARSE_NODES_XYZ) {
            int idnode = 0;
            double x = -10e30;
            double y = -10e30;
            double z = -10e30;
            double tokenvals[20];
            int ntoken = 0;

            std::string token;
            std::istringstream ss(line);
            while (std::getline(ss, token, ',') && ntoken < 20) {
                std::istringstream stoken(token);
                stoken >> tokenvals[ntoken];
                ++ntoken;
            }

            if (ntoken != 4)
                throw ChException("ERROR in .inp file, nodes require ID and three x y z coords, see line:\n" + line +
                                  "\n");

            x = tokenvals[1];
            y = tokenvals[2];
            z = tokenvals[3];
            if (x == -10e30 || y == -10e30 || z == -10e30)
                throw ChException("ERROR in .inp file, in parsing x,y,z coordinates of node: \n" + line + "\n");

            // TODO: is it worth to keep a so specific routine inside this function?
            // especially considering that is affecting only some types of elements...
            ChVector<> node_position(x, y, z);
            node_position = rot_transform * node_position;  // rotate/scale, if needed
            node_position = pos_transform + node_position;  // move, if needed

            idnode = static_cast<unsigned int>(tokenvals[0]);
            if (std::dynamic_pointer_cast<ChContinuumElastic>(my_material)) {
                auto mnode = chrono_types::make_shared<ChNodeFEAxyz>(node_position);
                mnode->SetIndex(idnode);
                parsed_nodes[idnode] = std::make_pair(mnode, false);
                if (!discard_unused_nodes)
                    mesh->AddNode(mnode);
            } else if (std::dynamic_pointer_cast<ChContinuumPoisson3D>(my_material)) {
                auto mnode = chrono_types::make_shared<ChNodeFEAxyzP>(ChVector<>(x, y, z));
                mnode->SetIndex(idnode);
                parsed_nodes[idnode] = std::make_pair(mnode, false);
                if (!discard_unused_nodes)
                    mesh->AddNode(mnode);
            } else
                throw ChException("ERROR in .inp generation. Material type not supported. \n");
        }

        // element parsing
        if (e_parse_section == E_PARSE_TETS_10 || e_parse_section == E_PARSE_TETS_4) {
            ////int idelem = 0;
            unsigned int tokenvals[20];
            int ntoken = 0;

            std::string token;
            std::istringstream ss(line);
            while (std::getline(ss, token, ',') && ntoken < 20) {
                std::istringstream stoken(token);
                stoken >> tokenvals[ntoken];
                ++ntoken;
            }

            if (e_parse_section == E_PARSE_TETS_10) {
                if (ntoken != 11)
                    throw ChException("ERROR in .inp file, tetrahedrons require ID and 10 node IDs, see line:\n" +
                                      line + "\n");
                // TODO: 'idelem' might be stored in an index in ChElementBase in order to provide consistency with the
                // INP file
                ////idelem = (int)tokenvals[0];

                for (int in = 0; in < 10; ++in)
                    if (tokenvals[in + 1] == -10e30)
                        throw ChException("ERROR in in .inp file, in parsing IDs of tetrahedron: \n" + line + "\n");
            } else if (e_parse_section == E_PARSE_TETS_4) {
                if (ntoken != 5)
                    throw ChException("ERROR in .inp file, tetrahedrons require ID and 4 node IDs, see line:\n" + line +
                                      "\n");

                // TODO: 'idelem' might be stored in an index in ChElementBase in order to provide consistency with the
                // INP file
                ////idelem = (int)tokenvals[0];

                for (int in = 0; in < 4; ++in)
                    if (tokenvals[in + 1] == -10e30)
                        throw ChException("ERROR in in .inp file, in parsing IDs of tetrahedron: \n" + line + "\n");
            }

            if (std::dynamic_pointer_cast<ChContinuumElastic>(my_material) ||
                std::dynamic_pointer_cast<ChContinuumPoisson3D>(my_material)) {
                std::array<std::shared_ptr<ChNodeFEAbase>, 4> element_nodes;
                for (auto node_sel = 0; node_sel < 4; ++node_sel) {
                    // check if the nodes required by the current element exist
                    std::pair<std::shared_ptr<ChNodeFEAbase>, bool>& node_found =
                        parsed_nodes.at(static_cast<unsigned int>(tokenvals[node_sel + 1]));

                    element_nodes[node_sel] = node_found.first;
                    node_found.second = true;
                }

                if (std::dynamic_pointer_cast<ChContinuumElastic>(my_material)) {
                    auto mel = chrono_types::make_shared<ChElementTetraCorot_4>();
                    mel->SetNodes(std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[3]),
                                  std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[1]),
                                  std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[2]),
                                  std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[0]));
                    mel->SetMaterial(std::static_pointer_cast<ChContinuumElastic>(my_material));
                    mesh->AddElement(mel);

                } else if (std::dynamic_pointer_cast<ChContinuumPoisson3D>(my_material)) {
                    auto mel = chrono_types::make_shared<ChElementTetraCorot_4_P>();
                    mel->SetNodes(std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[0]),
                                  std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[1]),
                                  std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[2]),
                                  std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[3]));
                    mel->SetMaterial(std::static_pointer_cast<ChContinuumPoisson3D>(my_material));
                    mesh->AddElement(mel);
                }

            } else
                throw ChException("ERROR in .inp generation. Material type not supported.\n");
        }

        // parsing nodesets
        if (e_parse_section == E_PARSE_NODESET) {
            unsigned int tokenvals[20];  // strictly speaking, the maximum is 16 nodes for each line
            int ntoken = 0;

            std::string token;
            std::istringstream ss(line);
            while (std::getline(ss, token, ',') && ntoken < 20) {
                if (!token.empty() && token.back() == '\r') {
                    // Fix for possible Windows line ending (\r\n)
                    break;
                }
                std::istringstream stoken(token);
                stoken >> tokenvals[ntoken];
                ++ntoken;
            }

            for (auto node_sel = 0; node_sel < ntoken; ++node_sel) {
                auto idnode = static_cast<int>(tokenvals[node_sel]);
                if (idnode > 0) {
                    // check if the nodeset is asking for an existing node
                    std::pair<std::shared_ptr<ChNodeFEAbase>, bool>& node_found =
                        parsed_nodes.at(static_cast<unsigned int>(tokenvals[node_sel]));

                    current_nodeset_vector->push_back(node_found.first);
                    // flag the node to be saved later into the mesh
                    node_found.second = true;

                } else
                    throw ChException("ERROR in .inp file, negative node ID: " + std::to_string(tokenvals[node_sel]));
            }
        }

    }  // end while

    // only used nodes have been saved in 'parsed_nodes_used' and are now inserted in the mesh node list
    if (discard_unused_nodes) {
        for (auto node_it = parsed_nodes.begin(); node_it != parsed_nodes.end(); ++node_it) {
            if (node_it->second.second)
                mesh->AddNode(node_it->second.first);
        }
    }
}